

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void same_stl_string_pointer_and_reference_are_equal(void)

{
  string *this;
  int line;
  string alice_reference;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string *actual_string;
  allocator *file;
  allocator local_39;
  string local_38 [35];
  undefined1 local_15;
  allocator local_1;
  
  this = (string *)operator_new(0x20);
  local_15 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this,"alice",&local_1);
  local_15 = 0;
  alice_pointer_abi_cxx11_ = (string *)this;
  std::allocator<char>::~allocator((allocator<char> *)&local_1);
  file = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"alice",file);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  actual_string = alice_pointer_abi_cxx11_;
  cgreen::create_equal_to_string_constraint(local_38,"alice_reference");
  cgreen::assert_that_<std::__cxx11::string*>
            ((char *)file,line,(char *)actual_string,in_stack_ffffffffffffff88,
             (Constraint *)0x11b0b6);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

Ensure(same_stl_string_pointer_and_reference_are_equal) {
    alice_pointer = new std::string("alice");
    std::string alice_reference("alice");

    assert_that(alice_pointer, is_equal_to_string(alice_reference));
}